

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIChain.cpp
# Opt level: O3

void __thiscall
adios2::aggregator::MPIChain::ResizeUpdateBuffer
          (MPIChain *this,size_t newSize,Buffer *buffer,string *hint)

{
  undefined8 *puVar1;
  pointer pcVar2;
  ulong uVar3;
  bool bVar4;
  char cVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_t sVar8;
  long *plVar9;
  ulong *puVar10;
  ulong uVar11;
  size_type *psVar12;
  char cVar13;
  string __str;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  ulong *local_190;
  uint local_188;
  undefined4 uStack_184;
  ulong local_180 [2];
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  char *local_130;
  uint local_128;
  char local_120 [16];
  string local_110;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (buffer->m_FixedSize == 0) {
    pcVar2 = (hint->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar2,pcVar2 + hint->_M_string_length);
    (*buffer->_vptr_Buffer[4])(buffer,newSize,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    buffer->m_Position = newSize;
    return;
  }
  if (newSize <= buffer->m_FixedSize) {
    return;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Toolkit","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"aggregator::mpi::MPIChain","");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"ResizeUpdateBuffer","");
  cVar13 = '\x01';
  if (9 < newSize) {
    sVar8 = newSize;
    cVar5 = '\x04';
    do {
      cVar13 = cVar5;
      if (sVar8 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0064406c;
      }
      if (sVar8 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0064406c;
      }
      if (sVar8 < 10000) goto LAB_0064406c;
      bVar4 = 99999 < sVar8;
      sVar8 = sVar8 / 10000;
      cVar5 = cVar13 + '\x04';
    } while (bVar4);
    cVar13 = cVar13 + '\x01';
  }
LAB_0064406c:
  local_130 = local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_130,local_128,newSize);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x74f9b3);
  local_150 = &local_140;
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_140 = *plVar9;
    lStack_138 = plVar6[3];
  }
  else {
    local_140 = *plVar9;
    local_150 = (long *)*plVar6;
  }
  local_148 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_160 = *puVar10;
    lStack_158 = plVar6[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar10;
    local_170 = (ulong *)*plVar6;
  }
  local_168 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar3 = buffer->m_FixedSize;
  cVar13 = '\x01';
  if (9 < uVar3) {
    uVar11 = uVar3;
    cVar5 = '\x04';
    do {
      cVar13 = cVar5;
      if (uVar11 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_006441b3;
      }
      if (uVar11 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_006441b3;
      }
      if (uVar11 < 10000) goto LAB_006441b3;
      bVar4 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar5 = cVar13 + '\x04';
    } while (bVar4);
    cVar13 = cVar13 + '\x01';
  }
LAB_006441b3:
  local_190 = local_180;
  std::__cxx11::string::_M_construct((ulong)&local_190,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_190,local_188,uVar3);
  uVar3 = CONCAT44(uStack_184,local_188) + local_168;
  uVar11 = 0xf;
  if (local_170 != &local_160) {
    uVar11 = local_160;
  }
  if (uVar11 < uVar3) {
    uVar11 = 0xf;
    if (local_190 != local_180) {
      uVar11 = local_180[0];
    }
    if (uVar3 <= uVar11) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_170);
      goto LAB_00644235;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_190);
LAB_00644235:
  local_1b0 = &local_1a0;
  puVar1 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar1) {
    local_1a0 = *puVar1;
    uStack_198 = puVar7[3];
  }
  else {
    local_1a0 = *puVar1;
    local_1b0 = (undefined8 *)*puVar7;
  }
  local_1a8 = puVar7[1];
  *puVar7 = puVar1;
  puVar7[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_c0 = *plVar9;
    lStack_b8 = plVar6[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar9;
    local_d0 = (long *)*plVar6;
  }
  local_c8 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_d0,(ulong)(buffer->m_Type)._M_dataplus._M_p);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_a0 = *plVar9;
    lStack_98 = plVar6[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar9;
    local_b0 = (long *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar12 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_90.field_2._M_allocated_capacity = *psVar12;
    local_90.field_2._8_8_ = plVar6[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar12;
    local_90._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_90._M_string_length = plVar6[1];
  *plVar6 = (long)psVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  helper::Throw<std::invalid_argument>(&local_70,&local_f0,&local_110,&local_90,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void MPIChain::ResizeUpdateBuffer(const size_t newSize, format::Buffer &buffer,
                                  const std::string hint)
{
    if (buffer.m_FixedSize > 0)
    {
        if (newSize > buffer.m_FixedSize)
        {
            helper::Throw<std::invalid_argument>(
                "Toolkit", "aggregator::mpi::MPIChain", "ResizeUpdateBuffer",
                "requesting new size: " + std::to_string(newSize) +
                    " bytes, for fixed size buffer " + std::to_string(buffer.m_FixedSize) +
                    " of type " + buffer.m_Type + ", allocate more memory");
        }
        return; // do nothing if fixed size is enough
    }

    buffer.Resize(newSize, hint);
    buffer.m_Position = newSize;
}